

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Aig_Man_t *
Aig_ManChoicePartitioned(Vec_Ptr_t *vAigs,int nPartSize,int nConfMax,int nLevelMax,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void **ppvVar5;
  Vec_Int_t *vPart;
  void **ppvVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  Vec_Ptr_t *pVVar10;
  Aig_Man_t *pAVar11;
  void *__s;
  Vec_Int_t *vSuppMap;
  int *piVar12;
  Aig_Man_t *pAVar13;
  Vec_Ptr_t *pVVar14;
  void *pvVar15;
  Aig_Man_t *p;
  Tim_Man_t *pTVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  
  if ((long)vAigs->nSize < 2) {
    __assert_fail("Vec_PtrSize(vAigs) > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x4ed,"Aig_Man_t *Aig_ManChoicePartitioned(Vec_Ptr_t *, int, int, int, int)");
  }
  lVar19 = 0;
  iVar22 = 0;
  do {
    iVar22 = iVar22 + *(int *)(*(long *)((long)vAigs->pArray[lVar19] + 0x20) + 4);
    lVar19 = lVar19 + 1;
  } while (vAigs->nSize != lVar19);
  pAVar13 = (Aig_Man_t *)*vAigs->pArray;
  pVVar10 = Aig_ManPartitionSmart(pAVar13,nPartSize,0,(Vec_Ptr_t **)0x0);
  pAVar11 = Aig_ManStartFrom(pAVar13);
  Aig_ManReprStart(pAVar11,iVar22);
  iVar22 = pAVar13->nObjs[3];
  __s = (void *)0x0;
  iVar8 = 8;
  if (6 < iVar22 - 1U) {
    iVar8 = iVar22;
  }
  if (iVar8 != 0) {
    __s = malloc((long)iVar8 << 3);
  }
  memset(__s,0,(long)iVar22 * 8);
  iVar8 = vAigs->nSize;
  if (0 < iVar8) {
    lVar19 = 0;
    do {
      pvVar15 = vAigs->pArray[lVar19];
      lVar21 = *(long *)((long)pvVar15 + 0x10);
      if (0 < *(int *)(lVar21 + 4)) {
        lVar17 = 0;
        do {
          **(long **)(*(long *)(lVar21 + 8) + lVar17 * 8) = lVar17;
          lVar17 = lVar17 + 1;
          lVar21 = *(long *)((long)pvVar15 + 0x10);
        } while (lVar17 < *(int *)(lVar21 + 4));
        iVar8 = vAigs->nSize;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar8);
  }
  vSuppMap = (Vec_Int_t *)malloc(0x10);
  vSuppMap->nCap = 100;
  vSuppMap->nSize = 0;
  piVar12 = (int *)malloc(400);
  vSuppMap->pArray = piVar12;
  iVar8 = pVVar10->nSize;
  lVar19 = (long)iVar8;
  if (0 < lVar19) {
    ppvVar5 = pVVar10->pArray;
    lVar21 = 0;
    do {
      vPart = (Vec_Int_t *)ppvVar5[lVar21];
      pAVar13 = Aig_ManStart(5000);
      vSuppMap->nSize = 0;
      if (0 < vAigs->nSize) {
        lVar17 = 0;
        do {
          pVVar14 = Aig_ManDupPart(pAVar13,(Aig_Man_t *)vAigs->pArray[lVar17],vPart,vSuppMap,0);
          if ((lVar17 == 0) && (iVar1 = pVVar14->nSize, 0 < (long)iVar1)) {
            ppvVar6 = pVVar14->pArray;
            lVar23 = 0;
            do {
              Aig_ObjCreateCo(pAVar13,(Aig_Obj_t *)ppvVar6[lVar23]);
              lVar23 = lVar23 + 1;
            } while (iVar1 != lVar23);
          }
          if (pVVar14->pArray != (void **)0x0) {
            free(pVVar14->pArray);
          }
          free(pVVar14);
          lVar17 = lVar17 + 1;
        } while (lVar17 < vAigs->nSize);
      }
      pVVar14 = Aig_ManDupPart(pAVar11,pAVar13,vPart,vSuppMap,1);
      iVar1 = pVVar14->nSize;
      ppvVar6 = pVVar14->pArray;
      if ((long)iVar1 < 1) {
        if (ppvVar6 != (void **)0x0) goto LAB_0063c9e2;
      }
      else {
        uVar18 = (ulong)(uint)vPart->nSize;
        if (vPart->nSize < 1) {
          uVar18 = 0;
        }
        uVar20 = 0;
        do {
          if (uVar18 == uVar20) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          lVar17 = (long)vPart->pArray[uVar20];
          if ((lVar17 < 0) || (iVar22 <= vPart->pArray[uVar20])) goto LAB_0063ccc2;
          if (*(long *)((long)__s + lVar17 * 8) != 0) {
            __assert_fail("Vec_PtrEntry( vOutsTotal, Vec_IntEntry(vPart,k) ) == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                          ,0x51b,
                          "Aig_Man_t *Aig_ManChoicePartitioned(Vec_Ptr_t *, int, int, int, int)");
          }
          *(void **)((long)__s + lVar17 * 8) = ppvVar6[uVar20];
          uVar20 = uVar20 + 1;
        } while ((long)iVar1 != uVar20);
LAB_0063c9e2:
        free(ppvVar6);
      }
      free(pVVar14);
      pVVar14 = pAVar13->vObjs;
      lVar17 = (long)pVVar14->nSize;
      pvVar15 = malloc(lVar17 * 8);
      if (0 < lVar17) {
        ppvVar6 = pVVar14->pArray;
        lVar23 = 0;
        do {
          pvVar7 = ppvVar6[lVar23];
          if (pvVar7 != (void *)0x0) {
            *(undefined8 *)((long)pvVar15 + lVar23 * 8) = *(undefined8 *)((long)pvVar7 + 0x28);
          }
          lVar23 = lVar23 + 1;
        } while (lVar17 != lVar23);
      }
      if (fVerbose != 0) {
        iVar1 = pAVar13->nObjs[2];
        uVar2 = pAVar13->nObjs[3];
        iVar3 = pAVar13->nObjs[6];
        iVar4 = pAVar13->nObjs[5];
        iVar9 = Aig_ManLevelNum(pAVar13);
        printf("Part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
               (ulong)((int)lVar21 + 1),lVar19,iVar1,(ulong)uVar2,(ulong)(uint)(iVar3 + iVar4),iVar9
              );
      }
      p = Fra_FraigChoice(pAVar13,nConfMax,nLevelMax);
      Aig_ManStop(p);
      pVVar14 = pAVar13->vObjs;
      if (0 < pVVar14->nSize) {
        lVar17 = 0;
        do {
          if (pVVar14->pArray[lVar17] != (void *)0x0) {
            *(undefined8 *)((long)pVVar14->pArray[lVar17] + 0x28) =
                 *(undefined8 *)((long)pvVar15 + lVar17 * 8);
            pVVar14 = pAVar13->vObjs;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < pVVar14->nSize);
      }
      if (pvVar15 != (void *)0x0) {
        free(pvVar15);
      }
      if (pAVar13->pReprs != (Aig_Obj_t **)0x0) {
        Aig_ManTransferRepr(pAVar11,pAVar13);
      }
      Aig_ManStop(pAVar13);
      lVar21 = lVar21 + 1;
    } while (lVar21 != lVar19);
  }
  if (fVerbose != 0) {
    printf(
          "                                                                                          \r"
          );
  }
  ppvVar5 = pVVar10->pArray;
  if (iVar8 < 1) {
    if (ppvVar5 != (void **)0x0) goto LAB_0063cb65;
  }
  else {
    lVar21 = 0;
    do {
      pvVar15 = ppvVar5[lVar21];
      if (pvVar15 != (void *)0x0) {
        if (*(void **)((long)pvVar15 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar15 + 8));
        }
        free(pvVar15);
      }
      lVar21 = lVar21 + 1;
    } while (lVar19 != lVar21);
LAB_0063cb65:
    free(ppvVar5);
  }
  free(pVVar10);
  if (vSuppMap->pArray != (int *)0x0) {
    free(vSuppMap->pArray);
  }
  free(vSuppMap);
  iVar8 = vAigs->nSize;
  if (0 < iVar8) {
    lVar19 = 0;
    do {
      pvVar15 = vAigs->pArray[lVar19];
      lVar21 = *(long *)((long)pvVar15 + 0x10);
      if (0 < *(int *)(lVar21 + 4)) {
        lVar17 = 0;
        do {
          **(undefined8 **)(*(long *)(lVar21 + 8) + lVar17 * 8) = 0;
          lVar17 = lVar17 + 1;
          lVar21 = *(long *)((long)pvVar15 + 0x10);
        } while (lVar17 < *(int *)(lVar21 + 4));
        iVar8 = vAigs->nSize;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar8);
  }
  if (iVar22 < 1) {
    if (__s == (void *)0x0) goto LAB_0063cc1b;
  }
  else {
    lVar19 = 0;
    do {
      Aig_ObjCreateCo(pAVar11,*(Aig_Obj_t **)((long)__s + lVar19 * 8));
      lVar19 = lVar19 + 1;
    } while (iVar22 != lVar19);
  }
  free(__s);
LAB_0063cc1b:
  pAVar13 = Aig_ManRehash(pAVar11);
  Aig_ManMarkValidChoices(pAVar13);
  if (0 < vAigs->nSize) {
    pVVar10 = Aig_ManOrderPios(pAVar13,(Aig_Man_t *)*vAigs->pArray);
    pAVar11 = Aig_ManDupDfsGuided(pAVar13,pVVar10);
    Aig_ManStop(pAVar13);
    if (pVVar10->pArray != (void **)0x0) {
      free(pVVar10->pArray);
    }
    free(pVVar10);
    if (0 < vAigs->nSize) {
      pTVar16 = *(Tim_Man_t **)((long)*vAigs->pArray + 0x160);
      if (pTVar16 != (Tim_Man_t *)0x0) {
        pTVar16 = Tim_ManDup(pTVar16,0);
        pAVar11->pManTime = pTVar16;
      }
      Aig_ManChoiceLevel(pAVar11);
      return pAVar11;
    }
  }
LAB_0063ccc2:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t * Aig_ManChoicePartitioned( Vec_Ptr_t * vAigs, int nPartSize, int nConfMax, int nLevelMax, int fVerbose )
{
//    extern int Cmd_CommandExecute( void * pAbc, char * sCommand );
//    extern void * Abc_FrameGetGlobalFrame();
//    extern Aig_Man_t * Fra_FraigChoice( Aig_Man_t * pManAig, int nConfMax, int nLevelMax );

    Vec_Ptr_t * vPios;
    Vec_Ptr_t * vOutsTotal, * vOuts;
    Aig_Man_t * pAigTotal, * pAigPart, * pAig, * pTemp;
    Vec_Int_t * vPart, * vPartSupp;
    Vec_Ptr_t * vParts;
    Aig_Obj_t * pObj;
    void ** ppData;
    int i, k, m, nIdMax;
    assert( Vec_PtrSize(vAigs) > 1 );

    // compute the total number of IDs
    nIdMax = 0;
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
        nIdMax += Aig_ManObjNumMax(pAig);

    // partition the first AIG in the array
    pAig = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    vParts = Aig_ManPartitionSmart( pAig, nPartSize, 0, NULL );

    // start the total fraiged AIG
    pAigTotal = Aig_ManStartFrom( pAig );
    Aig_ManReprStart( pAigTotal, nIdMax );
    vOutsTotal = Vec_PtrStart( Aig_ManCoNum(pAig) );

    // set the PI numbers
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
        Aig_ManForEachCi( pAig, pObj, k )
            pObj->pNext = (Aig_Obj_t *)(long)k;

//    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // create the total fraiged AIG
    vPartSupp = Vec_IntAlloc( 100 ); // maps part PI num into total PI num
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        // derive the partition AIG
        pAigPart = Aig_ManStart( 5000 );
//        pAigPart->pName = Extra_UtilStrsav( pAigPart->pName );
        Vec_IntClear( vPartSupp );
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, k )
        {
            vOuts = Aig_ManDupPart( pAigPart, pAig, vPart, vPartSupp, 0 );
            if ( k == 0 )
            {
                Vec_PtrForEachEntry( Aig_Obj_t *, vOuts, pObj, m )
                    Aig_ObjCreateCo( pAigPart, pObj );
            }
            Vec_PtrFree( vOuts );
        }
        // derive the total AIG from the partitioned AIG
        vOuts = Aig_ManDupPart( pAigTotal, pAigPart, vPart, vPartSupp, 1 );
        // add to the outputs
        Vec_PtrForEachEntry( Aig_Obj_t *, vOuts, pObj, k )
        {
            assert( Vec_PtrEntry( vOutsTotal, Vec_IntEntry(vPart,k) ) == NULL );
            Vec_PtrWriteEntry( vOutsTotal, Vec_IntEntry(vPart,k), pObj );
        }
        Vec_PtrFree( vOuts );
        // store contents of pData pointers
        ppData = ABC_ALLOC( void *, Aig_ManObjNumMax(pAigPart) );
        Aig_ManForEachObj( pAigPart, pObj, k )
            ppData[k] = pObj->pData;
        // report the process
        if ( fVerbose )
        printf( "Part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Aig_ManCiNum(pAigPart), Aig_ManCoNum(pAigPart), 
            Aig_ManNodeNum(pAigPart), Aig_ManLevelNum(pAigPart) );
        // compute equivalence classes (to be stored in pNew->pReprs)
        pAig = Fra_FraigChoice( pAigPart, nConfMax, nLevelMax );
        Aig_ManStop( pAig );
        // reset the pData pointers
        Aig_ManForEachObj( pAigPart, pObj, k )
            pObj->pData = ppData[k];
        ABC_FREE( ppData );
        // transfer representatives to the total AIG
        if ( pAigPart->pReprs )
            Aig_ManTransferRepr( pAigTotal, pAigPart );
        Aig_ManStop( pAigPart );
    }
    if ( fVerbose )
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );
    Vec_IntFree( vPartSupp );

//    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    // clear the PI numbers
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
        Aig_ManForEachCi( pAig, pObj, k )
            pObj->pNext = NULL;

    // add the outputs in the same order
    Vec_PtrForEachEntry( Aig_Obj_t *, vOutsTotal, pObj, i )
        Aig_ObjCreateCo( pAigTotal, pObj );
    Vec_PtrFree( vOutsTotal );

    // derive the result of choicing
    pAig = Aig_ManRehash( pAigTotal );
    // create the equivalent nodes lists
    Aig_ManMarkValidChoices( pAig );
    // reconstruct the network
    vPios = Aig_ManOrderPios( pAig, (Aig_Man_t *)Vec_PtrEntry(vAigs,0) );
    pAig = Aig_ManDupDfsGuided( pTemp = pAig, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );
    // duplicate the timing manager
    pTemp = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    if ( pTemp->pManTime )
        pAig->pManTime = Tim_ManDup( (Tim_Man_t *)pTemp->pManTime, 0 );
    // reset levels
    Aig_ManChoiceLevel( pAig );
    return pAig;
}